

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int htrans64(LONGLONG *a,int nx,int ny)

{
  long lVar1;
  sbyte sVar2;
  LONGLONG *tmp_00;
  long lVar3;
  int in_EDX;
  int iVar4;
  int in_ESI;
  long in_RDI;
  double dVar5;
  double dVar6;
  LONGLONG *tmp;
  LONGLONG mask2;
  LONGLONG mask;
  LONGLONG nrnd2;
  LONGLONG prnd2;
  LONGLONG prnd;
  LONGLONG hc;
  LONGLONG hy;
  LONGLONG hx;
  LONGLONG h0;
  int s00;
  int s10;
  int shift;
  int oddy;
  int oddx;
  int k;
  int j;
  int i;
  int nytop;
  int nxtop;
  int log2n;
  int nmax;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_9c;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  int local_48;
  int local_44;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_4;
  
  local_9c = in_EDX;
  if (in_EDX < in_ESI) {
    local_9c = in_ESI;
  }
  dVar5 = log((double)local_9c);
  dVar6 = log(2.0);
  local_20 = (int)(dVar5 / dVar6 + 0.5);
  if (1 << ((byte)local_20 & 0x1f) < local_9c) {
    local_20 = local_20 + 1;
  }
  tmp_00 = (LONGLONG *)malloc((long)((local_9c + 1) / 2) << 3);
  if (tmp_00 == (LONGLONG *)0x0) {
    ffpmsg((char *)0x262aec);
    local_4 = 0x19d;
  }
  else {
    sVar2 = 0;
    local_88 = 0xfffffffffffffffe;
    local_90 = 0xfffffffffffffffc;
    local_70 = 1;
    local_78 = 2;
    local_80 = 1;
    local_28 = in_EDX;
    local_24 = in_ESI;
    for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
      iVar4 = local_28 % 2;
      for (local_2c = 0; local_2c < local_24 - local_24 % 2; local_2c = local_2c + 2) {
        local_48 = local_2c * in_EDX;
        local_44 = local_48 + in_EDX;
        for (local_30 = 0; local_30 < local_28 - iVar4; local_30 = local_30 + 2) {
          lVar3 = *(long *)(in_RDI + (long)(local_44 + 1) * 8) +
                  *(long *)(in_RDI + (long)local_44 * 8) +
                  *(long *)(in_RDI + (long)(local_48 + 1) * 8) +
                  *(long *)(in_RDI + (long)local_48 * 8) >> sVar2;
          local_b0 = ((*(long *)(in_RDI + (long)(local_44 + 1) * 8) +
                      *(long *)(in_RDI + (long)local_44 * 8)) -
                     *(long *)(in_RDI + (long)(local_48 + 1) * 8)) -
                     *(long *)(in_RDI + (long)local_48 * 8) >> sVar2;
          local_b8 = ((*(long *)(in_RDI + (long)(local_44 + 1) * 8) -
                      *(long *)(in_RDI + (long)local_44 * 8)) +
                     *(long *)(in_RDI + (long)(local_48 + 1) * 8)) -
                     *(long *)(in_RDI + (long)local_48 * 8) >> sVar2;
          *(long *)(in_RDI + (long)(local_44 + 1) * 8) =
               ((*(long *)(in_RDI + (long)(local_44 + 1) * 8) -
                *(long *)(in_RDI + (long)local_44 * 8)) -
               *(long *)(in_RDI + (long)(local_48 + 1) * 8)) +
               *(long *)(in_RDI + (long)local_48 * 8) >> sVar2;
          if (-1 < (long)local_b0) {
            local_b0 = local_b0 + local_70;
          }
          *(ulong *)(in_RDI + (long)local_44 * 8) = local_b0 & local_88;
          if (-1 < (long)local_b8) {
            local_b8 = local_b8 + local_70;
          }
          *(ulong *)(in_RDI + (long)(local_48 + 1) * 8) = local_b8 & local_88;
          lVar1 = local_80;
          if (-1 < lVar3) {
            lVar1 = local_78;
          }
          local_c0 = lVar3 + lVar1;
          *(ulong *)(in_RDI + (long)local_48 * 8) = local_c0 & local_90;
          local_48 = local_48 + 2;
          local_44 = local_44 + 2;
        }
        if (iVar4 != 0) {
          lVar3 = *(long *)(in_RDI + (long)local_44 * 8) + *(long *)(in_RDI + (long)local_48 * 8) <<
                  (1U - sVar2 & 0x3f);
          local_c8 = *(long *)(in_RDI + (long)local_44 * 8) - *(long *)(in_RDI + (long)local_48 * 8)
                     << (1U - sVar2 & 0x3f);
          if (-1 < (long)local_c8) {
            local_c8 = local_c8 + local_70;
          }
          *(ulong *)(in_RDI + (long)local_44 * 8) = local_c8 & local_88;
          lVar1 = local_80;
          if (-1 < lVar3) {
            lVar1 = local_78;
          }
          local_d0 = lVar3 + lVar1;
          *(ulong *)(in_RDI + (long)local_48 * 8) = local_d0 & local_90;
        }
      }
      if (local_24 % 2 != 0) {
        local_48 = local_2c * in_EDX;
        for (local_30 = 0; local_30 < local_28 - iVar4; local_30 = local_30 + 2) {
          lVar3 = *(long *)(in_RDI + (long)(local_48 + 1) * 8) +
                  *(long *)(in_RDI + (long)local_48 * 8) << (1U - sVar2 & 0x3f);
          local_d8 = *(long *)(in_RDI + (long)(local_48 + 1) * 8) -
                     *(long *)(in_RDI + (long)local_48 * 8) << (1U - sVar2 & 0x3f);
          if (-1 < (long)local_d8) {
            local_d8 = local_d8 + local_70;
          }
          *(ulong *)(in_RDI + (long)(local_48 + 1) * 8) = local_d8 & local_88;
          lVar1 = local_80;
          if (-1 < lVar3) {
            lVar1 = local_78;
          }
          local_e0 = lVar3 + lVar1;
          *(ulong *)(in_RDI + (long)local_48 * 8) = local_e0 & local_90;
          local_48 = local_48 + 2;
        }
        if (iVar4 != 0) {
          lVar3 = *(long *)(in_RDI + (long)local_48 * 8) << (2U - sVar2 & 0x3f);
          if (-1 < lVar3) {
            local_80 = local_78;
          }
          local_e8 = lVar3 + local_80;
          *(ulong *)(in_RDI + (long)local_48 * 8) = local_e8 & local_90;
        }
      }
      for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
        shuffle64((LONGLONG *)(in_RDI + (long)(in_EDX * local_2c) * 8),local_28,1,tmp_00);
      }
      for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
        shuffle64((LONGLONG *)(in_RDI + (long)local_30 * 8),local_24,in_EDX,tmp_00);
      }
      local_24 = local_24 + 1 >> 1;
      local_28 = local_28 + 1 >> 1;
      sVar2 = 1;
      local_88 = local_90;
      local_70 = local_78;
      local_90 = local_90 << 1;
      local_78 = local_78 * 2;
      local_80 = local_78 + -1;
    }
    free(tmp_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int htrans64(LONGLONG a[],int nx,int ny)
{
int nmax, log2n, nxtop, nytop, i, j, k;
int oddx, oddy;
int shift;
int s10, s00;
LONGLONG h0, hx, hy, hc, prnd, prnd2, nrnd2, mask, mask2;
LONGLONG *tmp;

	/*
	 * log2n is log2 of max(nx,ny) rounded up to next power of 2
	 */
	nmax = (nx>ny) ? nx : ny;
	log2n = (int) (log((float) nmax)/log(2.0)+0.5);
	if ( nmax > (1<<log2n) ) {
		log2n += 1;
	}
	/*
	 * get temporary storage for shuffling elements
	 */
	tmp = (LONGLONG *) malloc(((nmax+1)/2)*sizeof(LONGLONG));
	if(tmp == (LONGLONG *) NULL) {
	        ffpmsg("htrans64: insufficient memory");
		return(DATA_COMPRESSION_ERR);
	}
	/*
	 * set up rounding and shifting masks
	 */
	shift = 0;
	mask  = (LONGLONG) -2;
	mask2 = mask << 1;
	prnd  = (LONGLONG) 1;
	prnd2 = prnd << 1;
	nrnd2 = prnd2 - 1;
	/*
	 * do log2n reductions
	 *
	 * We're indexing a as a 2-D array with dimensions (nx,ny).
	 */
	nxtop = nx;
	nytop = ny;

	for (k = 0; k<log2n; k++) {
		oddx = nxtop % 2;
		oddy = nytop % 2;
		for (i = 0; i<nxtop-oddx; i += 2) {
			s00 = i*ny;				/* s00 is index of a[i,j]	*/
			s10 = s00+ny;			/* s10 is index of a[i+1,j]	*/
			for (j = 0; j<nytop-oddy; j += 2) {
				/*
				 * Divide h0,hx,hy,hc by 2 (1 the first time through).
				 */
				h0 = (a[s10+1] + a[s10] + a[s00+1] + a[s00]) >> shift;
				hx = (a[s10+1] + a[s10] - a[s00+1] - a[s00]) >> shift;
				hy = (a[s10+1] - a[s10] + a[s00+1] - a[s00]) >> shift;
				hc = (a[s10+1] - a[s10] - a[s00+1] + a[s00]) >> shift;

				/*
				 * Throw away the 2 bottom bits of h0, bottom bit of hx,hy.
				 * To get rounding to be same for positive and negative
				 * numbers, nrnd2 = prnd2 - 1.
				 */
				a[s10+1] = hc;
				a[s10  ] = ( (hx>=0) ? (hx+prnd)  :  hx        ) & mask ;
				a[s00+1] = ( (hy>=0) ? (hy+prnd)  :  hy        ) & mask ;
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
				s00 += 2;
				s10 += 2;
			}
			if (oddy) {
				/*
				 * do last element in row if row length is odd
				 * s00+1, s10+1 are off edge
				 */
				h0 = (a[s10] + a[s00]) << (1-shift);
				hx = (a[s10] - a[s00]) << (1-shift);
				a[s10  ] = ( (hx>=0) ? (hx+prnd)  :  hx        ) & mask ;
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
				s00 += 1;
				s10 += 1;
			}
		}
		if (oddx) {
			/*
			 * do last row if column length is odd
			 * s10, s10+1 are off edge
			 */
			s00 = i*ny;
			for (j = 0; j<nytop-oddy; j += 2) {
				h0 = (a[s00+1] + a[s00]) << (1-shift);
				hy = (a[s00+1] - a[s00]) << (1-shift);
				a[s00+1] = ( (hy>=0) ? (hy+prnd)  :  hy        ) & mask ;
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
				s00 += 2;
			}
			if (oddy) {
				/*
				 * do corner element if both row and column lengths are odd
				 * s00+1, s10, s10+1 are off edge
				 */
				h0 = a[s00] << (2-shift);
				a[s00  ] = ( (h0>=0) ? (h0+prnd2) : (h0+nrnd2) ) & mask2;
			}
		}
		/*
		 * now shuffle in each dimension to group coefficients by order
		 */
		for (i = 0; i<nxtop; i++) {
			shuffle64(&a[ny*i],nytop,1,tmp);
		}
		for (j = 0; j<nytop; j++) {
			shuffle64(&a[j],nxtop,ny,tmp);
		}
		/*
		 * image size reduced by 2 (round up if odd)
		 */
		nxtop = (nxtop+1)>>1;
		nytop = (nytop+1)>>1;
		/*
		 * divisor doubles after first reduction
		 */
		shift = 1;
		/*
		 * masks, rounding values double after each iteration
		 */
		mask  = mask2;
		prnd  = prnd2;
		mask2 = mask2 << 1;
		prnd2 = prnd2 << 1;
		nrnd2 = prnd2 - 1;
	}
	free(tmp);
	return(0);
}